

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snake.cpp
# Opt level: O3

void __thiscall Snake::Snake(Snake *this,Point *p,Point *dir)

{
  pointer *pppOVar1;
  iterator __position;
  Head *this_00;
  Head *local_30;
  
  (this->body).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->body).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->body).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->alive = true;
  this_00 = (Head *)operator_new(0x20);
  Head::Head(this_00,p,dir);
  this->head = this_00;
  this->tail = (PObject)this_00;
  __position._M_current =
       (this->body).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->body).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    local_30 = this_00;
    std::vector<Object*,std::allocator<Object*>>::_M_realloc_insert<Object*>
              ((vector<Object*,std::allocator<Object*>> *)&this->body,__position,
               (Object **)&local_30);
  }
  else {
    *__position._M_current = (Object *)this_00;
    pppOVar1 = &(this->body).super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppOVar1 = *pppOVar1 + 1;
  }
  return;
}

Assistant:

Snake::Snake(const Point& p, const Point& dir){
	alive = true;
	head = new Head(p, dir);
	tail = head;
	body.push_back(head);
}